

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall ary::CameraModel::CameraModel(CameraModel *this,string *calibration)

{
  char cVar1;
  undefined8 *puVar2;
  runtime_error *this_00;
  Matx<float,_3,_3> local_150;
  Mat ti;
  FileStorage fs;
  Mat td;
  
  this->_vptr_CameraModel = (_func_int **)&PTR__CameraModel_0012e6a8;
  cv::Matx<float,_3,_3>::Matx(&this->intrinsics);
  cv::Mat::Mat(&this->distortion);
  cv::FileStorage::FileStorage(&fs);
  ti._0_8_ = &ti.data;
  ti.rows = 0;
  ti.cols = 0;
  ti.data._0_1_ = 0;
  cVar1 = cv::FileStorage::open((string *)&fs,(int)calibration,(string *)0x0);
  std::__cxx11::string::~string((string *)&ti);
  if (cVar1 != '\0') {
    cv::Mat::Mat(&ti);
    cv::Mat::Mat(&td);
    cv::FileStorage::operator[]((char *)&local_150);
    cv::operator>>((FileNode *)&local_150,&ti);
    cv::FileStorage::operator[]((char *)&local_150);
    cv::operator>>((FileNode *)&local_150,&td);
    cv::Mat::operator_cast_to_Matx(&local_150,&ti);
    (this->intrinsics).val[8] = local_150.val[8];
    *(undefined8 *)((this->intrinsics).val + 4) = local_150.val._16_8_;
    *(undefined8 *)((this->intrinsics).val + 6) = local_150.val._24_8_;
    *(undefined8 *)(this->intrinsics).val = local_150.val._0_8_;
    *(undefined8 *)((this->intrinsics).val + 2) = local_150.val._8_8_;
    cv::Mat::operator=(&this->distortion,&td);
    cv::Mat::~Mat(&td);
    cv::Mat::~Mat(&ti);
    cv::FileStorage::~FileStorage(&fs);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  this_00 = (runtime_error *)operator_new(0x10);
  std::runtime_error::runtime_error(this_00,"Calibration file does not extist");
  *puVar2 = this_00;
  __cxa_throw(puVar2,&std::runtime_error*::typeinfo,0);
}

Assistant:

CameraModel::CameraModel(const string& calibration) {

    FileStorage fs;

    if (!fs.open(calibration, FileStorage::READ))
        throw new runtime_error("Calibration file does not extist");

    Mat ti, td;

    fs["intrinsics"] >> ti;
    fs["distortion"] >> td;

    intrinsics = ti;
    distortion = td;
}